

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isModifierAllowedAfter(TokenKind mod,TokenKind prev)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,mod);
  if ((iVar1 != 0x67) && (iVar1 != 0x11c)) {
    if (iVar1 == 0x143) {
      return prev == ConstKeyword;
    }
    return false;
  }
  return prev == ConstKeyword || prev == VarKeyword;
}

Assistant:

bool SyntaxFacts::isModifierAllowedAfter(TokenKind mod, TokenKind prev) {
    switch (mod) {
        case TokenKind::ConstKeyword: return false;
        case TokenKind::VarKeyword: return prev == TokenKind::ConstKeyword;
        case TokenKind::StaticKeyword:
        case TokenKind::AutomaticKeyword:
            return prev == TokenKind::VarKeyword || prev == TokenKind::ConstKeyword;
        default:
            return false;
    }
}